

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall brynet::net::EventLoop::processAsyncProcs(EventLoop *this)

{
  pointer pfVar1;
  _Any_data *p_Var2;
  undefined8 uVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pfVar7;
  pointer pfVar8;
  pointer pfVar9;
  uint uVar10;
  ulong uVar11;
  _Any_data *p_Var12;
  long lVar13;
  
  uVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->mAsyncProcsMutex);
  if (uVar10 != 0) {
    uVar11 = (ulong)uVar10;
    std::__throw_system_error(uVar10);
    uVar5 = *(undefined4 *)(uVar11 + 0xa0);
    uVar6 = *(undefined4 *)(uVar11 + 0xa8);
    uVar3 = *(undefined8 *)(uVar11 + 0xb0);
    lVar13 = *(long *)(uVar11 + 0x88);
    lVar4 = *(long *)(uVar11 + 0x90);
    *(long *)(uVar11 + 0xa0) = lVar13;
    *(long *)(uVar11 + 0xa8) = lVar4;
    *(undefined8 *)(uVar11 + 0xb0) = *(undefined8 *)(uVar11 + 0x98);
    *(undefined4 *)(uVar11 + 0x88) = uVar5;
    *(undefined4 *)(uVar11 + 0x8c) = *(undefined4 *)(uVar11 + 0xa4);
    *(undefined4 *)(uVar11 + 0x90) = uVar6;
    *(undefined4 *)(uVar11 + 0x94) = *(undefined4 *)(uVar11 + 0xac);
    *(undefined8 *)(uVar11 + 0x98) = uVar3;
    while( true ) {
      if (lVar13 == lVar4) {
        std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_erase_at_end((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                        (uVar11 + 0xa0),
                        (((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                           *)(uVar11 + 0xa0))->
                        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
        return;
      }
      if (*(long *)(lVar13 + 0x10) == 0) break;
      (**(code **)(lVar13 + 0x18))(lVar13);
      lVar13 = lVar13 + 0x20;
    }
    std::__throw_bad_function_call();
  }
  pfVar7 = (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar8 = (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar1 = (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->mCopyAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->mAsyncProcs).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  pfVar9 = (this->mAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->mCopyAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->mAsyncProcs).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->mCopyAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar9;
  (this->mAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = pfVar7;
  (this->mAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar8;
  (this->mAsyncProcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mAsyncProcsMutex);
  p_Var12 = (_Any_data *)
            (this->mCopyAsyncProcs).
            super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (_Any_data *)
           (this->mCopyAsyncProcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (p_Var12 == p_Var2) {
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_M_erase_at_end
                (&this->mCopyAsyncProcs,
                 (this->mCopyAsyncProcs).
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      return;
    }
    if (*(long *)(p_Var12 + 1) == 0) break;
    (**(code **)(p_Var12->_M_pod_data + 0x18))(p_Var12);
    p_Var12 = p_Var12 + 2;
  }
  std::__throw_bad_function_call();
}

Assistant:

void EventLoop::processAsyncProcs()
{
    {
        std::lock_guard<std::mutex> lck(mAsyncProcsMutex);
        mCopyAsyncProcs.swap(mAsyncProcs);
    }

    for (const auto& x : mCopyAsyncProcs)
    {
        x();
    }
    mCopyAsyncProcs.clear();
}